

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

S2LatLngRect * __thiscall
S2LatLngRect::PolarClosure(S2LatLngRect *__return_storage_ptr__,S2LatLngRect *this)

{
  double dVar1;
  S1Interval local_28;
  S2LatLngRect *local_18;
  S2LatLngRect *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  dVar1 = R1Interval::lo(&this->lat_);
  if ((dVar1 != -1.5707963267948966) || (NAN(dVar1))) {
    dVar1 = R1Interval::hi(&this->lat_);
    if ((dVar1 != 1.5707963267948966) || (NAN(dVar1))) {
      S2LatLngRect(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  local_28 = S1Interval::Full();
  S2LatLngRect(__return_storage_ptr__,&this->lat_,&local_28);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2LatLngRect::PolarClosure() const {
  if (lat_.lo() == -M_PI_2 || lat_.hi() == M_PI_2) {
    return S2LatLngRect(lat_, S1Interval::Full());
  }
  return *this;
}